

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O0

void test_qclab_qgates_iSWAP<std::complex<double>>(void)

{
  allocator<std::complex<double>_> *paVar1;
  complex<double> m02;
  complex<double> m02_00;
  complex<double> m03;
  complex<double> m03_00;
  complex<double> m10;
  complex<double> m10_00;
  complex<double> m11;
  complex<double> m11_00;
  complex<double> m12;
  complex<double> m12_00;
  complex<double> m13;
  complex<double> m13_00;
  complex<double> m20;
  complex<double> m20_00;
  complex<double> m21;
  complex<double> m21_00;
  complex<double> m22;
  complex<double> m22_00;
  complex<double> m23;
  complex<double> m23_00;
  complex<double> m30;
  complex<double> m30_00;
  complex<double> m31;
  complex<double> m31_00;
  complex<double> m32;
  complex<double> m32_00;
  complex<double> m33;
  complex<double> m33_00;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  initializer_list<std::complex<double>_> __l_01;
  initializer_list<std::complex<double>_> __l_02;
  initializer_list<std::complex<double>_> __l_03;
  initializer_list<std::complex<double>_> __l_04;
  initializer_list<std::complex<double>_> __l_05;
  initializer_list<std::complex<double>_> __l_06;
  initializer_list<std::complex<double>_> __l_07;
  initializer_list<std::complex<double>_> __l_08;
  initializer_list<std::complex<double>_> __l_09;
  initializer_list<std::complex<double>_> __l_10;
  initializer_list<std::complex<double>_> __l_11;
  initializer_list<std::complex<double>_> __l_12;
  initializer_list<std::complex<double>_> __l_13;
  initializer_list<std::complex<double>_> __l_14;
  initializer_list<std::complex<double>_> __l_15;
  bool bVar2;
  char *pcVar3;
  reference pvVar4;
  int *rhs;
  complex<double> *pcVar5;
  undefined8 uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *qubits_00;
  data_type *m2;
  SquareMatrix<std::complex<double>_> *matrix;
  char *in_R9;
  complex<double> m00;
  complex<double> m00_00;
  complex<double> m01;
  complex<double> m01_00;
  undefined8 in_stack_ffffffffffffe378;
  undefined8 in_stack_ffffffffffffe380;
  undefined8 in_stack_ffffffffffffe388;
  undefined8 in_stack_ffffffffffffe390;
  SquareMatrix<std::complex<double>_> local_1b10;
  SquareMatrix<std::complex<double>_> local_1b00;
  undefined1 local_1af0 [8];
  SquareMatrix<std::complex<double>_> mat3_1;
  SquareMatrix<std::complex<double>_> check;
  complex<double> i_1;
  iSWAP<std::complex<double>_> iswap_6;
  SquareMatrix<std::complex<double>_> local_1aa0;
  SquareMatrix<std::complex<double>_> local_1a90;
  SquareMatrix<std::complex<double>_> local_1a80;
  SquareMatrix<std::complex<double>_> local_1a70;
  SquareMatrix<std::complex<double>_> local_1a60;
  SquareMatrix<std::complex<double>_> local_1a50;
  SquareMatrix<std::complex<double>_> local_1a40;
  SquareMatrix<std::complex<double>_> local_1a30;
  SquareMatrix<std::complex<double>_> local_1a20;
  int local_1a10 [2];
  int qnew_2 [2];
  SquareMatrix<std::complex<double>_> local_19f8;
  SquareMatrix<std::complex<double>_> local_19e8;
  SquareMatrix<std::complex<double>_> local_19d8;
  SquareMatrix<std::complex<double>_> local_19c8;
  SquareMatrix<std::complex<double>_> local_19b8;
  SquareMatrix<std::complex<double>_> local_19a8;
  SquareMatrix<std::complex<double>_> local_1998;
  SquareMatrix<std::complex<double>_> local_1988;
  SquareMatrix<std::complex<double>_> local_1978;
  undefined1 local_1968 [8];
  SquareMatrix<std::complex<double>_> mat3;
  SquareMatrix<std::complex<double>_> local_1948;
  SquareMatrix<std::complex<double>_> local_1938;
  SquareMatrix<std::complex<double>_> local_1928;
  SquareMatrix<std::complex<double>_> local_1918;
  SquareMatrix<std::complex<double>_> local_1908;
  SquareMatrix<std::complex<double>_> local_18f8;
  undefined1 local_18e8 [8];
  SquareMatrix<std::complex<double>_> iswapH;
  SquareMatrix<std::complex<double>_> local_18c8;
  SquareMatrix<std::complex<double>_> local_18b8;
  SquareMatrix<std::complex<double>_> local_18a8;
  SquareMatrix<std::complex<double>_> local_1898;
  SquareMatrix<std::complex<double>_> local_1888;
  SquareMatrix<std::complex<double>_> local_1878;
  complex<double> local_1868;
  complex<double> local_1858;
  complex<double> local_1848;
  complex<double> local_1838;
  complex<double> local_1828;
  complex<double> local_1818;
  complex<double> local_1808;
  complex<double> local_17f8;
  complex<double> local_17e8;
  complex<double> local_17d8;
  complex<double> local_17c8;
  complex<double> local_17b8;
  complex<double> local_17a8;
  complex<double> local_1798;
  complex<double> local_1788;
  complex<double> local_1778;
  undefined1 local_1768 [8];
  SquareMatrix<std::complex<double>_> mat;
  SquareMatrix<std::complex<double>_> local_1748;
  undefined1 local_1738 [8];
  SquareMatrix<std::complex<double>_> mat2;
  iSWAP<std::complex<double>_> iswap_5;
  allocator<std::complex<double>_> local_1679;
  complex<double> local_1678;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  iterator local_15f0;
  size_type local_15e8;
  undefined1 local_15e0 [8];
  V check3_1;
  V vec3_1;
  iSWAP<std::complex<double>_> iswap_4;
  complex<double> local_1490 [16];
  iterator local_1390;
  undefined8 local_1388;
  complex<double> local_1380 [16];
  iterator local_1280;
  undefined8 local_1278;
  complex<double> local_1270 [16];
  iterator local_1170;
  undefined8 local_1168;
  complex<double> local_1160 [16];
  iterator local_1060;
  undefined8 local_1058;
  allocator<std::complex<double>_> local_1049;
  complex<double> local_1048 [16];
  iterator local_f48;
  size_type local_f40;
  undefined1 local_f38 [8];
  V check4;
  V vec4;
  complex<double> local_e78;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  iterator local_df0;
  undefined8 local_de8;
  int local_de0 [2];
  int qnew_1 [2];
  allocator<std::complex<double>_> local_d39;
  complex<double> local_d38;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  iterator local_cb8;
  size_type local_cb0;
  undefined1 local_ca8 [8];
  V check3;
  V vec3;
  allocator<std::complex<double>_> local_c19;
  complex<double> local_c18;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  iterator local_bd8;
  size_type local_bd0;
  undefined1 local_bc8 [8];
  V check2;
  V vec2;
  iSWAP<std::complex<double>_> iswap_3;
  Message local_b80;
  int local_b74;
  vector<int,_std::allocator<int>_> local_b70;
  undefined1 local_b58 [8];
  AssertionResult gtest_ar_14;
  Message local_b40;
  int local_b34;
  vector<int,_std::allocator<int>_> local_b30;
  undefined1 local_b18 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_ae8;
  Message local_ae0;
  bool local_ad1;
  undefined1 local_ad0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_aa0;
  Message local_a98;
  bool local_a89;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar__7;
  Message local_a70;
  int local_a68;
  int local_a64;
  undefined1 local_a60 [8];
  AssertionResult gtest_ar_12;
  iSWAP<std::complex<double>_> iswap_2;
  int qubits_1 [2];
  Message local_a30;
  int local_a24;
  vector<int,_std::allocator<int>_> local_a20;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar_11;
  Message local_9f0;
  int local_9e4;
  vector<int,_std::allocator<int>_> local_9e0;
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_998;
  Message local_990;
  bool local_981;
  undefined1 local_980 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_950;
  Message local_948;
  bool local_939;
  undefined1 local_938 [8];
  AssertionResult gtest_ar__5;
  Message local_920;
  int local_918;
  int local_914;
  undefined1 local_910 [8];
  AssertionResult gtest_ar_9;
  iSWAP<std::complex<double>_> iswap_1;
  AssertHelper local_8d0;
  Message local_8c8;
  bool local_8b9;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_888;
  Message local_880;
  bool local_871;
  undefined1 local_870 [8];
  AssertionResult gtest_ar__3;
  iSWAP<std::complex<double>_> iswap2;
  AssertHelper local_830;
  Message local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_8;
  Message local_7e8;
  int local_7e0;
  int local_7dc;
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar_7;
  stringstream qasm;
  ostream local_7b8 [376];
  string local_640;
  AssertHelper local_620;
  Message local_618;
  SquareMatrix<std::complex<double>_> local_610;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar__2;
  undefined8 uStack_5e0;
  complex<double> local_5d8;
  complex<double> local_5c8;
  complex<double> local_5b8;
  complex<double> local_5a8;
  complex<double> local_598;
  tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_> local_588;
  undefined8 uStack_580;
  complex<double> local_578;
  complex<double> local_568;
  tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_> local_558;
  undefined8 uStack_550;
  complex<double> local_540;
  complex<double> local_530;
  complex<double> local_520;
  complex<double> local_510;
  complex<double> local_500;
  complex<double> local_4f0;
  undefined1 local_4e0 [8];
  SquareMatrix<std::complex<double>_> iSWAP_check;
  complex<double> i;
  Message local_4b8;
  int local_4ac;
  vector<int,_std::allocator<int>_> local_4a8;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_6;
  Message local_478;
  int local_46c;
  vector<int,_std::allocator<int>_> local_468;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_5;
  int qnew [2];
  Message local_430;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_4;
  Message local_408;
  int local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_3;
  Message local_3e0;
  int local_3d4;
  size_type local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_2;
  vector<int,_std::allocator<int>_> qubits;
  Message local_398;
  int local_390;
  int local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_358;
  Message local_350;
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_310;
  Message local_308;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_;
  Message local_2e0;
  int local_2d8;
  int local_2d4;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar;
  iSWAP<std::complex<double>_> iswap;
  complex<double> local_2a8 [16];
  iterator local_1a8;
  size_type local_1a0;
  undefined1 local_198 [8];
  V v4;
  complex<double> local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  iterator local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  V v3;
  complex<double> local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  V v2;
  SquareMatrix<std::complex<double>_> I4;
  SquareMatrix<std::complex<double>_> I3;
  undefined1 local_28 [8];
  SquareMatrix<std::complex<double>_> I2;
  SquareMatrix<std::complex<double>_> I1;
  
  qclab::dense::eye<std::complex<double>>((int64_t)&I2.data_);
  qclab::dense::eye<std::complex<double>>((int64_t)local_28);
  qclab::dense::eye<std::complex<double>>((int64_t)&I4.data_);
  qclab::dense::eye<std::complex<double>>
            ((int64_t)&v2.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_98 = 0x401c000000000000;
  uStack_90 = 0;
  local_a8 = 0x4000000000000000;
  uStack_a0 = 0;
  local_b8 = 0x4014000000000000;
  uStack_b0 = 0;
  local_c8._M_value._0_8_ = 0x4008000000000000;
  local_c8._M_value._8_8_ = 0;
  local_80 = &local_c8;
  local_78 = 4;
  paVar1 = (allocator<std::complex<double>_> *)
           ((long)&v3.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l_15._M_len = local_78;
  __l_15._M_array = local_80;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_70,__l_15
             ,paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&v3.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_108 = 0x4008000000000000;
  uStack_100 = 0;
  local_118 = 0x4020000000000000;
  uStack_110 = 0;
  local_128 = 0x3ff0000000000000;
  uStack_120 = 0;
  local_138 = 0x4010000000000000;
  uStack_130 = 0;
  local_148 = 0x401c000000000000;
  uStack_140 = 0;
  local_158 = 0x4000000000000000;
  uStack_150 = 0;
  local_168 = 0x4014000000000000;
  uStack_160 = 0;
  local_178._M_value._0_8_ = 0x4008000000000000;
  local_178._M_value._8_8_ = 0;
  local_f8 = &local_178;
  local_f0 = 8;
  paVar1 = (allocator<std::complex<double>_> *)
           ((long)&v4.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l_14._M_len = local_f0;
  __l_14._M_array = local_f8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8,__l_14
             ,paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&v4.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  memcpy(local_2a8,&DAT_00693b48,0x100);
  local_1a0 = 0x10;
  paVar1 = (allocator<std::complex<double>_> *)((long)iswap.qubits_._M_elems + 7);
  local_1a8 = local_2a8;
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l_13._M_len = local_1a0;
  __l_13._M_array = local_1a8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198,
             __l_13,paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)((long)iswap.qubits_._M_elems + 7));
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP
            ((iSWAP<std::complex<double>_> *)&gtest_ar.message_);
  local_2d4 = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                        ((QGate2<std::complex<double>_> *)&gtest_ar.message_);
  local_2d8 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2d0,"iswap.nbQubits()","2",&local_2d4,&local_2d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_2e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_2f9 = qclab::qgates::iSWAP<std::complex<double>_>::fixed
                        ((iSWAP<std::complex<double>_> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f8,&local_2f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar2) {
    testing::Message::Message(&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_2f8,
               (AssertionResult *)"iswap.fixed()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  bVar2 = qclab::qgates::iSWAP<std::complex<double>_>::controlled
                    ((iSWAP<std::complex<double>_> *)&gtest_ar.message_);
  local_341 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_340,&local_341,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_340,
               (AssertionResult *)"iswap.controlled()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  local_38c = qclab::qgates::iSWAP<std::complex<double>_>::qubit
                        ((iSWAP<std::complex<double>_> *)&gtest_ar.message_);
  local_390 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_388,"iswap.qubit()","0",&local_38c,&local_390);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar2) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x40,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_398);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,
             (iSWAP<std::complex<double>_> *)&gtest_ar.message_);
  local_3d0 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  local_3d4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3c8,"qubits.size()","2",&local_3d0,&local_3d4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar2) {
    testing::Message::Message(&local_3e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,0);
  local_3fc = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3f8,"qubits[0]","0",pvVar4,&local_3fc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar2) {
    testing::Message::Message(&local_408);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,1);
  local_424 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_420,"qubits[1]","1",pvVar4,&local_424);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar2) {
    testing::Message::Message(&local_430);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qnew,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qnew,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qnew);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x500000003;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits
            ((iSWAP<std::complex<double>_> *)&gtest_ar.message_,(int *)&gtest_ar_5.message_);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            (&local_468,(iSWAP<std::complex<double>_> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_468,0);
  local_46c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_450,"iswap.qubits()[0]","3",pvVar4,&local_46c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_468);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar2) {
    testing::Message::Message(&local_478);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            (&local_4a8,(iSWAP<std::complex<double>_> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_4a8,1);
  local_4ac = 5;
  rhs = &local_4ac;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_490,"iswap.qubits()[1]","5",pvVar4,rhs);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar2) {
    testing::Message::Message(&local_4b8);
    rhs = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_490);
    pvVar4 = (reference)0x4a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(i._M_value + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x4a,(char *)rhs);
    testing::internal::AssertHelper::operator=((AssertHelper *)(i._M_value + 8),&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(i._M_value + 8));
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x100000000;
  qubits_00 = &gtest_ar_5.message_;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits
            ((iSWAP<std::complex<double>_> *)&gtest_ar.message_,(int *)qubits_00);
  std::complex<double>::complex((complex<double> *)&iSWAP_check.data_,0.0,1.0);
  std::complex<double>::complex(&local_4f0,1.0,0.0);
  std::complex<double>::complex(&local_500,0.0,0.0);
  std::complex<double>::complex(&local_510,0.0,0.0);
  std::complex<double>::complex(&local_520,0.0,0.0);
  std::complex<double>::complex(&local_530,0.0,0.0);
  std::complex<double>::complex(&local_540,0.0,0.0);
  local_558.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
       (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
       iSWAP_check.data_._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  uStack_550 = i._M_value._0_8_;
  std::complex<double>::complex(&local_568,0.0,0.0);
  std::complex<double>::complex(&local_578,0.0,0.0);
  local_588.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
       (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
       iSWAP_check.data_._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  uStack_580 = i._M_value._0_8_;
  std::complex<double>::complex(&local_598,0.0,0.0);
  std::complex<double>::complex(&local_5a8,0.0,0.0);
  std::complex<double>::complex(&local_5b8,0.0,0.0);
  std::complex<double>::complex(&local_5c8,0.0,0.0);
  std::complex<double>::complex(&local_5d8,0.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__2.message_,1.0,0.0);
  m02._M_value._8_8_ = local_530._M_value._8_8_;
  m02._M_value._0_8_ = local_530._M_value._0_8_;
  m03._M_value._8_8_ = local_540._M_value._8_8_;
  m03._M_value._0_8_ = local_540._M_value._0_8_;
  m10._M_value._8_8_ = uStack_550;
  m10._M_value._0_8_ =
       local_558.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  m11._M_value._8_8_ = local_568._M_value._8_8_;
  m11._M_value._0_8_ = local_568._M_value._0_8_;
  m12._M_value._8_8_ = local_578._M_value._8_8_;
  m12._M_value._0_8_ = local_578._M_value._0_8_;
  m13._M_value._8_8_ = uStack_580;
  m13._M_value._0_8_ =
       local_588.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  m20._M_value._8_8_ = local_598._M_value._8_8_;
  m20._M_value._0_8_ = local_598._M_value._0_8_;
  m21._M_value._8_8_ = local_5a8._M_value._8_8_;
  m21._M_value._0_8_ = local_5a8._M_value._0_8_;
  m22._M_value._8_8_ = local_5b8._M_value._8_8_;
  m22._M_value._0_8_ = local_5b8._M_value._0_8_;
  m23._M_value._8_8_ = local_5c8._M_value._8_8_;
  m23._M_value._0_8_ = local_5c8._M_value._0_8_;
  m30._M_value._8_8_ = local_5d8._M_value._8_8_;
  m30._M_value._0_8_ = local_5d8._M_value._0_8_;
  m31._M_value._8_8_ = uStack_5e0;
  m31._M_value._0_8_ =
       gtest_ar__2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m32._M_value._8_8_ = in_stack_ffffffffffffe380;
  m32._M_value._0_8_ = in_stack_ffffffffffffe378;
  m33._M_value._8_8_ = in_stack_ffffffffffffe390;
  m33._M_value._0_8_ = in_stack_ffffffffffffe388;
  m00._M_value._8_8_ = extraout_RDX;
  m00._M_value._0_8_ = qubits_00;
  m01._M_value._8_8_ = rhs;
  m01._M_value._0_8_ = pvVar4;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_4e0,m00,m01,m02,m03,m10,m11,m12,m13,m20,
             m21,m22,m23,m30,m31,m32,m33);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&local_610);
  local_5f9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                        (&local_610,(SquareMatrix<std::complex<double>_> *)local_4e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f8,&local_5f9,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_610);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar2) {
    testing::Message::Message(&local_618);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_640,(internal *)local_5f8,(AssertionResult *)"iswap.matrix() == iSWAP_check",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=(&local_620,&local_618);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    std::__cxx11::string::~string((string *)&local_640);
    testing::Message::~Message(&local_618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  qclab::qgates::QGate2<std::complex<double>_>::print
            ((QGate2<std::complex<double>_> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_7.message_);
  local_7dc = qclab::qgates::iSWAP<std::complex<double>_>::toQASM
                        ((iSWAP<std::complex<double>_> *)&gtest_ar.message_,local_7b8,0);
  local_7e0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_7d8,"iswap.toQASM( qasm )","0",&local_7dc,&local_7e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar2) {
    testing::Message::Message(&local_7e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[19],_nullptr>
            ((EqHelper *)local_800,"qasm.str()","\"iswap q[0], q[1];\\n\"",&local_820,
             (char (*) [19])"iswap q[0], q[1];\n");
  std::__cxx11::string::~string((string *)&local_820);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar2) {
    testing::Message::Message(&local_828);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              (&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_830,&local_828);
    testing::internal::AssertHelper::~AssertHelper(&local_830);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,(string *)&iswap2.qubits_);
  std::__cxx11::string::~string((string *)&iswap2.qubits_);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP
            ((iSWAP<std::complex<double>_> *)&gtest_ar__3.message_,2,4);
  local_871 = qclab::QObject<std::complex<double>_>::operator==
                        ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                         (QObject<std::complex<double>_> *)&gtest_ar__3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_870,&local_871,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
  if (!bVar2) {
    testing::Message::Message(&local_880);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_870,
               (AssertionResult *)"iswap == iswap2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_888,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=(&local_888,&local_880);
    testing::internal::AssertHelper::~AssertHelper(&local_888);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  bVar2 = qclab::QObject<std::complex<double>_>::operator!=
                    ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                     (QObject<std::complex<double>_> *)&gtest_ar__3.message_);
  local_8b9 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8b8,&local_8b9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
  if (!bVar2) {
    testing::Message::Message(&local_8c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&iswap_1.qubits_,(internal *)local_8b8,(AssertionResult *)"iswap != iswap2"
               ,"true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8d0,&local_8c8);
    testing::internal::AssertHelper::~AssertHelper(&local_8d0);
    std::__cxx11::string::~string((string *)&iswap_1.qubits_);
    testing::Message::~Message(&local_8c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
  qclab::qgates::iSWAP<std::complex<double>_>::~iSWAP
            ((iSWAP<std::complex<double>_> *)&gtest_ar__3.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_7.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_4e0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  qclab::qgates::iSWAP<std::complex<double>_>::~iSWAP
            ((iSWAP<std::complex<double>_> *)&gtest_ar.message_);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP
            ((iSWAP<std::complex<double>_> *)&gtest_ar_9.message_,3,5);
  local_914 = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                        ((QGate2<std::complex<double>_> *)&gtest_ar_9.message_);
  local_918 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_910,"iswap.nbQubits()","2",&local_914,&local_918);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar2) {
    testing::Message::Message(&local_920);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_910);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_920);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  local_939 = qclab::qgates::iSWAP<std::complex<double>_>::fixed
                        ((iSWAP<std::complex<double>_> *)&gtest_ar_9.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_938,&local_939,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_938);
  if (!bVar2) {
    testing::Message::Message(&local_948);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_938,
               (AssertionResult *)"iswap.fixed()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_950,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_950,&local_948);
    testing::internal::AssertHelper::~AssertHelper(&local_950);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_938);
  bVar2 = qclab::qgates::iSWAP<std::complex<double>_>::controlled
                    ((iSWAP<std::complex<double>_> *)&gtest_ar_9.message_);
  local_981 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_980,&local_981,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
  if (!bVar2) {
    testing::Message::Message(&local_990);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_980,
               (AssertionResult *)"iswap.controlled()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_998,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_998,&local_990);
    testing::internal::AssertHelper::~AssertHelper(&local_998);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_990);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            (&local_9e0,(iSWAP<std::complex<double>_> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_9e0,0);
  local_9e4 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9c8,"iswap.qubits()[0]","3",pvVar4,&local_9e4);
  std::vector<int,_std::allocator<int>_>::~vector(&local_9e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c8);
  if (!bVar2) {
    testing::Message::Message(&local_9f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_9f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            (&local_a20,(iSWAP<std::complex<double>_> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_a20,1);
  local_a24 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a08,"iswap.qubits()[1]","5",pvVar4,&local_a24);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
  if (!bVar2) {
    testing::Message::Message(&local_a30);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qubits_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qubits_1,&local_a30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qubits_1);
    testing::Message::~Message(&local_a30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
  qclab::qgates::iSWAP<std::complex<double>_>::~iSWAP
            ((iSWAP<std::complex<double>_> *)&gtest_ar_9.message_);
  iswap_2.qubits_._M_elems[0] = 3;
  iswap_2.qubits_._M_elems[1] = 5;
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP
            ((iSWAP<std::complex<double>_> *)&gtest_ar_12.message_,iswap_2.qubits_._M_elems);
  local_a64 = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                        ((QGate2<std::complex<double>_> *)&gtest_ar_12.message_);
  local_a68 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a60,"iswap.nbQubits()","2",&local_a64,&local_a68);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a60);
  if (!bVar2) {
    testing::Message::Message(&local_a70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_a70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a60);
  local_a89 = qclab::qgates::iSWAP<std::complex<double>_>::fixed
                        ((iSWAP<std::complex<double>_> *)&gtest_ar_12.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a88,&local_a89,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
  if (!bVar2) {
    testing::Message::Message(&local_a98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_a88,
               (AssertionResult *)"iswap.fixed()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_aa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=(&local_aa0,&local_a98);
    testing::internal::AssertHelper::~AssertHelper(&local_aa0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_a98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
  bVar2 = qclab::qgates::iSWAP<std::complex<double>_>::controlled
                    ((iSWAP<std::complex<double>_> *)&gtest_ar_12.message_);
  local_ad1 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ad0,&local_ad1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad0);
  if (!bVar2) {
    testing::Message::Message(&local_ae0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_13.message_,(internal *)local_ad0,
               (AssertionResult *)"iswap.controlled()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ae8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=(&local_ae8,&local_ae0);
    testing::internal::AssertHelper::~AssertHelper(&local_ae8);
    std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_ae0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad0);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            (&local_b30,(iSWAP<std::complex<double>_> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_b30,0);
  local_b34 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b18,"iswap.qubits()[0]","3",pvVar4,&local_b34);
  std::vector<int,_std::allocator<int>_>::~vector(&local_b30);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
  if (!bVar2) {
    testing::Message::Message(&local_b40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x77,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_b40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_b40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            (&local_b70,(iSWAP<std::complex<double>_> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_b70,1);
  local_b74 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b58,"iswap.qubits()[1]","5",pvVar4,&local_b74);
  std::vector<int,_std::allocator<int>_>::~vector(&local_b70);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b58);
  if (!bVar2) {
    testing::Message::Message(&local_b80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iswap_3.qubits_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iswap_3.qubits_,&local_b80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iswap_3.qubits_);
    testing::Message::~Message(&local_b80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
  qclab::qgates::iSWAP<std::complex<double>_>::~iSWAP
            ((iSWAP<std::complex<double>_> *)&gtest_ar_12.message_);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,1);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_70);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_be8 = 0x401c000000000000;
  uStack_be0 = 0;
  local_bf8 = 0;
  uStack_bf0 = 0x4014000000000000;
  local_c08 = 0;
  uStack_c00 = 0x4000000000000000;
  local_c18._M_value._0_8_ = 0x4008000000000000;
  local_c18._M_value._8_8_ = 0;
  local_bd8 = &local_c18;
  local_bd0 = 4;
  std::allocator<std::complex<double>_>::allocator(&local_c19);
  __l_12._M_len = local_bd0;
  __l_12._M_array = local_bd8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_bc8,
             __l_12,&local_c19);
  std::allocator<std::complex<double>_>::~allocator(&local_c19);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_bc8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_70);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  __l_11._M_len = 4;
  __l_11._M_array =
       (iterator)
       &vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_bc8,
             __l_11);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_bc8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_cc8 = 0x4008000000000000;
  uStack_cc0 = 0;
  local_cd8 = 0x4020000000000000;
  uStack_cd0 = 0;
  local_ce8 = 0;
  uStack_ce0 = 0x401c000000000000;
  local_cf8 = 0;
  uStack_cf0 = 0x4000000000000000;
  local_d08 = 0;
  uStack_d00 = 0x3ff0000000000000;
  local_d18 = 0;
  uStack_d10 = 0x4010000000000000;
  local_d28 = 0x4014000000000000;
  uStack_d20 = 0;
  local_d38._M_value._0_8_ = 0x4008000000000000;
  local_d38._M_value._8_8_ = 0;
  local_cb8 = &local_d38;
  local_cb0 = 8;
  std::allocator<std::complex<double>_>::allocator(&local_d39);
  __l_10._M_len = local_cb0;
  __l_10._M_array = local_cb8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_ca8,
             __l_10,&local_d39);
  std::allocator<std::complex<double>_>::~allocator(&local_d39);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_ca8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  qnew_1[0] = 0;
  qnew_1[1] = 0x40080000;
  __l_09._M_len = 8;
  __l_09._M_array = (iterator)qnew_1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_ca8,
             __l_09);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_ca8);
  local_de0[0] = 1;
  local_de0[1] = 2;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_de0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_e08 = 0x4008000000000000;
  uStack_e00 = 0;
  local_e18 = 0;
  uStack_e10 = 0x3ff0000000000000;
  local_e28 = 0;
  uStack_e20 = 0x4020000000000000;
  local_e38 = 0x4010000000000000;
  uStack_e30 = 0;
  local_e48 = 0x401c000000000000;
  uStack_e40 = 0;
  local_e58 = 0;
  uStack_e50 = 0x4014000000000000;
  local_e68 = 0;
  uStack_e60 = 0x4000000000000000;
  local_e78._M_value._0_8_ = 0x4008000000000000;
  local_e78._M_value._8_8_ = 0;
  local_df0 = &local_e78;
  local_de8 = 8;
  __l_08._M_len = 8;
  __l_08._M_array = local_df0;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_ca8,
             __l_08);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_ca8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  vec4.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  __l_07._M_len = 8;
  __l_07._M_array =
       (iterator)
       &vec4.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_ca8,
             __l_07);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_ca8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  memcpy(local_1048,&DAT_00693ec8,0x100);
  local_f40 = 0x10;
  local_f48 = local_1048;
  std::allocator<std::complex<double>_>::allocator(&local_1049);
  __l_06._M_len = local_f40;
  __l_06._M_array = local_f48;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38,
             __l_06,&local_1049);
  std::allocator<std::complex<double>_>::~allocator(&local_1049);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  memcpy(local_1160,&DAT_00693fc8,0x100);
  local_1058 = 0x10;
  __l_05._M_len = 0x10;
  __l_05._M_array = local_1160;
  local_1060 = local_1160;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38,
             __l_05);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38);
  local_de0[0] = 0;
  local_de0[1] = 1;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_de0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  memcpy(local_1270,&DAT_006940c8,0x100);
  local_1168 = 0x10;
  __l_04._M_len = 0x10;
  __l_04._M_array = local_1270;
  local_1170 = local_1270;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38,
             __l_04);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  memcpy(local_1380,&DAT_006941c8,0x100);
  local_1278 = 0x10;
  __l_03._M_len = 0x10;
  __l_03._M_array = local_1380;
  local_1280 = local_1380;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38,
             __l_03);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38);
  local_de0[0] = 2;
  local_de0[1] = 3;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_de0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  memcpy(local_1490,&DAT_006942c8,0x100);
  local_1388 = 0x10;
  __l_02._M_len = 0x10;
  __l_02._M_array = local_1490;
  local_1390 = local_1490;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38,
             __l_02);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  memcpy(&iswap_4.qubits_,&DAT_006943c8,0x100);
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)&iswap_4.qubits_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38,
             __l_01);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_f38);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_ca8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_bc8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::iSWAP<std::complex<double>_>::~iSWAP
            ((iSWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP
            ((iSWAP<std::complex<double>_> *)
             &vec3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,2);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_1608 = 0x4008000000000000;
  uStack_1600 = 0;
  local_1618 = 0;
  uStack_1610 = 0x401c000000000000;
  local_1628 = 0x3ff0000000000000;
  uStack_1620 = 0;
  local_1638 = 0;
  uStack_1630 = 0x4014000000000000;
  local_1648 = 0;
  uStack_1640 = 0x4020000000000000;
  local_1658 = 0x4000000000000000;
  uStack_1650 = 0;
  local_1668 = 0;
  uStack_1660 = 0x4010000000000000;
  local_1678._M_value._0_8_ = 0x4008000000000000;
  local_1678._M_value._8_8_ = 0;
  local_15f0 = &local_1678;
  local_15e8 = 8;
  std::allocator<std::complex<double>_>::allocator(&local_1679);
  __l_00._M_len = local_15e8;
  __l_00._M_array = local_15f0;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_15e0,
             __l_00,&local_1679);
  std::allocator<std::complex<double>_>::~allocator(&local_1679);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_15e0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)
             &vec3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  iswap_5.qubits_._M_elems[0] = 0;
  iswap_5.qubits_._M_elems[1] = 0x40080000;
  __l._M_len = 8;
  __l._M_array = (iterator)&iswap_5.qubits_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_15e0,__l)
  ;
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_15e0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_15e0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::iSWAP<std::complex<double>_>::~iSWAP
            ((iSWAP<std::complex<double>_> *)
             &vec3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP
            ((iSWAP<std::complex<double>_> *)&mat2.data_,0,1);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1738,
             (SquareMatrix<std::complex<double>_> *)local_28);
  uVar6 = 2;
  matrix = (SquareMatrix<std::complex<double>_> *)local_1738;
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Left,NoTrans,2,matrix,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1748,(SquareMatrix<std::complex<double>_> *)local_1738);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&mat.data_);
  m2 = &mat.data_;
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1748,(SquareMatrix<std::complex<double>_> *)m2);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&mat.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1748);
  std::complex<double>::complex(&local_1778,1.0,0.0);
  std::complex<double>::complex(&local_1788,2.0,0.0);
  std::complex<double>::complex(&local_1798,3.0,0.0);
  std::complex<double>::complex(&local_17a8,4.0,0.0);
  std::complex<double>::complex(&local_17b8,5.0,0.0);
  std::complex<double>::complex(&local_17c8,6.0,0.0);
  std::complex<double>::complex(&local_17d8,7.0,0.0);
  std::complex<double>::complex(&local_17e8,8.0,0.0);
  std::complex<double>::complex(&local_17f8,9.0,0.0);
  std::complex<double>::complex(&local_1808,10.0,0.0);
  std::complex<double>::complex(&local_1818,11.0,0.0);
  std::complex<double>::complex(&local_1828,12.0,0.0);
  std::complex<double>::complex(&local_1838,13.0,0.0);
  std::complex<double>::complex(&local_1848,14.0,0.0);
  std::complex<double>::complex(&local_1858,15.0,0.0);
  std::complex<double>::complex(&local_1868,16.0,0.0);
  m02_00._M_value._8_8_ = local_17b8._M_value._8_8_;
  m02_00._M_value._0_8_ = local_17b8._M_value._0_8_;
  m03_00._M_value._8_8_ = local_17c8._M_value._8_8_;
  m03_00._M_value._0_8_ = local_17c8._M_value._0_8_;
  m10_00._M_value._8_8_ = local_17d8._M_value._8_8_;
  m10_00._M_value._0_8_ = local_17d8._M_value._0_8_;
  m11_00._M_value._8_8_ = local_17e8._M_value._8_8_;
  m11_00._M_value._0_8_ = local_17e8._M_value._0_8_;
  m12_00._M_value._8_8_ = local_17f8._M_value._8_8_;
  m12_00._M_value._0_8_ = local_17f8._M_value._0_8_;
  m13_00._M_value._8_8_ = local_1808._M_value._8_8_;
  m13_00._M_value._0_8_ = local_1808._M_value._0_8_;
  m20_00._M_value._8_8_ = local_1818._M_value._8_8_;
  m20_00._M_value._0_8_ = local_1818._M_value._0_8_;
  m21_00._M_value._8_8_ = local_1828._M_value._8_8_;
  m21_00._M_value._0_8_ = local_1828._M_value._0_8_;
  m22_00._M_value._8_8_ = local_1838._M_value._8_8_;
  m22_00._M_value._0_8_ = local_1838._M_value._0_8_;
  m23_00._M_value._8_8_ = local_1848._M_value._8_8_;
  m23_00._M_value._0_8_ = local_1848._M_value._0_8_;
  m30_00._M_value._8_8_ = local_1858._M_value._8_8_;
  m30_00._M_value._0_8_ = local_1858._M_value._0_8_;
  m31_00._M_value._8_8_ = local_1868._M_value._8_8_;
  m31_00._M_value._0_8_ = local_1868._M_value._0_8_;
  m32_00._M_value._8_8_ = in_stack_ffffffffffffe380;
  m32_00._M_value._0_8_ = in_stack_ffffffffffffe378;
  m33_00._M_value._8_8_ = in_stack_ffffffffffffe390;
  m33_00._M_value._0_8_ = in_stack_ffffffffffffe388;
  m00_00._M_value._8_8_ = extraout_RDX_00;
  m00_00._M_value._0_8_ = m2;
  m01_00._M_value._8_8_ = matrix;
  m01_00._M_value._0_8_ = uVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1768,m00_00,m01_00,m02_00,m03_00,m10_00,
             m11_00,m12_00,m13_00,m20_00,m21_00,m22_00,m23_00,m30_00,m31_00,m32_00,m33_00);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1738,
             (SquareMatrix<std::complex<double>_> *)local_1768);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_1738,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1878,(SquareMatrix<std::complex<double>_> *)local_1738);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1898,(SquareMatrix<std::complex<double>_> *)local_1768);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&local_18a8);
  qclab::dense::operator*((dense *)&local_1888,&local_1898,&local_18a8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1878,&local_1888);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1888);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_18a8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1898);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1878);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1738,
             (SquareMatrix<std::complex<double>_> *)local_1768);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_1738,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_18b8,(SquareMatrix<std::complex<double>_> *)local_1738);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&iswapH.data_)
  ;
  qclab::dense::operator*
            ((dense *)&local_18c8,(SquareMatrix<std::complex<double>_> *)&iswapH.data_,
             (SquareMatrix<std::complex<double>_> *)local_1768);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_18b8,&local_18c8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_18c8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&iswapH.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_18b8);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&local_18f8);
  qclab::dense::conjTrans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)local_18e8,&local_18f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_18f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1738,
             (SquareMatrix<std::complex<double>_> *)local_1768);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Left,ConjTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_1738,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1908,(SquareMatrix<std::complex<double>_> *)local_1738);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1928,(SquareMatrix<std::complex<double>_> *)local_1768);
  qclab::dense::operator*
            ((dense *)&local_1918,&local_1928,(SquareMatrix<std::complex<double>_> *)local_18e8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1908,&local_1918);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1918);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1928);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1908);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1738,
             (SquareMatrix<std::complex<double>_> *)local_1768);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Right,ConjTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_1738,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1938,(SquareMatrix<std::complex<double>_> *)local_1738);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&mat3.data_,
             (SquareMatrix<std::complex<double>_> *)local_18e8);
  qclab::dense::operator*
            ((dense *)&local_1948,(SquareMatrix<std::complex<double>_> *)&mat3.data_,
             (SquareMatrix<std::complex<double>_> *)local_1768);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1938,&local_1948);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1948);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&mat3.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1938);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1968,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1968,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1978,(SquareMatrix<std::complex<double>_> *)local_1968);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&local_1998);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1988,&local_1998,(SquareMatrix<std::complex<double>_> *)&I2.data_);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1978,&local_1988);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1988);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1998);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1978);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1968,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Right,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1968,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_19a8,(SquareMatrix<std::complex<double>_> *)local_1968);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&local_19c8);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_19b8,&local_19c8,(SquareMatrix<std::complex<double>_> *)&I2.data_);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_19a8,&local_19b8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_19b8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_19c8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_19a8);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1968,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Left,ConjTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1968,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_19d8,(SquareMatrix<std::complex<double>_> *)local_1968);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_19e8,(SquareMatrix<std::complex<double>_> *)local_18e8,
             (SquareMatrix<std::complex<double>_> *)&I2.data_);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_19d8,&local_19e8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_19e8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_19d8);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1968,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Right,ConjTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1968,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_19f8,(SquareMatrix<std::complex<double>_> *)local_1968);
  qclab::dense::kron<std::complex<double>>
            ((dense *)qnew_2,(SquareMatrix<std::complex<double>_> *)local_18e8,
             (SquareMatrix<std::complex<double>_> *)&I2.data_);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_19f8,(SquareMatrix<std::complex<double>_> *)qnew_2);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)qnew_2);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_19f8);
  local_1a10[0] = 1;
  local_1a10[1] = 2;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits
            ((iSWAP<std::complex<double>_> *)&mat2.data_,local_1a10);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1968,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1968,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1a20,(SquareMatrix<std::complex<double>_> *)local_1968);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&local_1a40);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1a30,(SquareMatrix<std::complex<double>_> *)&I2.data_,&local_1a40);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1a20,&local_1a30);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1a30);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1a40);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1a20);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1968,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Right,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1968,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1a50,(SquareMatrix<std::complex<double>_> *)local_1968);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&local_1a70);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1a60,(SquareMatrix<std::complex<double>_> *)&I2.data_,&local_1a70);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1a50,&local_1a60);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1a60);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1a70);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1a50);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1968,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Left,ConjTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1968,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1a80,(SquareMatrix<std::complex<double>_> *)local_1968);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1a90,(SquareMatrix<std::complex<double>_> *)&I2.data_,
             (SquareMatrix<std::complex<double>_> *)local_18e8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1a80,&local_1a90);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1a90);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1a80);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1968,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&mat2.data_,Right,ConjTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1968,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1aa0,(SquareMatrix<std::complex<double>_> *)local_1968);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&iswap_6.qubits_,(SquareMatrix<std::complex<double>_> *)&I2.data_,
             (SquareMatrix<std::complex<double>_> *)local_18e8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1aa0,(SquareMatrix<std::complex<double>_> *)&iswap_6.qubits_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&iswap_6.qubits_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1aa0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1968);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_18e8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1768);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1738);
  qclab::qgates::iSWAP<std::complex<double>_>::~iSWAP((iSWAP<std::complex<double>_> *)&mat2.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP
            ((iSWAP<std::complex<double>_> *)(i_1._M_value + 8),0,2);
  std::complex<double>::complex((complex<double> *)&check.data_,0.0,1.0);
  qclab::dense::zeros<std::complex<double>>((int64_t)&mat3_1.data_);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,0,0);
  std::complex<double>::operator=(pcVar5,1.0);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,4,1);
  *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true> *
   )pcVar5->_M_value =
       check.data_._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  *(undefined8 *)(pcVar5->_M_value + 8) = i_1._M_value._0_8_;
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,2,2);
  std::complex<double>::operator=(pcVar5,1.0);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,6,3);
  *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true> *
   )pcVar5->_M_value =
       check.data_._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  *(undefined8 *)(pcVar5->_M_value + 8) = i_1._M_value._0_8_;
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,1,4);
  *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true> *
   )pcVar5->_M_value =
       check.data_._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  *(undefined8 *)(pcVar5->_M_value + 8) = i_1._M_value._0_8_;
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,5,5);
  std::complex<double>::operator=(pcVar5,1.0);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,3,6);
  *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true> *
   )pcVar5->_M_value =
       check.data_._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  *(undefined8 *)(pcVar5->_M_value + 8) = i_1._M_value._0_8_;
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,7,7);
  std::complex<double>::operator=(pcVar5,1.0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1af0,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)(i_1._M_value + 8),Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1af0,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1b00,(SquareMatrix<std::complex<double>_> *)local_1af0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1b10,(SquareMatrix<std::complex<double>_> *)&mat3_1.data_);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1b00,&local_1b10);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1b10);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1b00);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1af0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::~iSWAP
            ((iSWAP<std::complex<double>_> *)(i_1._M_value + 8));
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_70);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)
             &v2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&I4.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_28);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&I2.data_);
  return;
}

Assistant:

void test_qclab_qgates_iSWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::iSWAP< T >  iswap ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( iswap.qubit() , 0 ) ;

    // qubits
    auto qubits = iswap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    iswap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    iswap.setQubits( &qnew[0] ) ;

    // matrix
    const T i(0,1) ;
    qclab::dense::SquareMatrix< T >  iSWAP_check( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , i , 0 ,
                                                  0 , i , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( iswap.matrix() == iSWAP_check ) ;

    // print
    iswap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( iswap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "iswap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::iSWAP< T >  iswap2( 2 , 4 ) ;
    EXPECT_TRUE(  iswap == iswap2 ) ;
    EXPECT_FALSE( iswap != iswap2 ) ;
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 3 , 5 ) ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::iSWAP< T >  iswap( &qubits[0] ) ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    iswap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , T(0,2) , T(0,5) , 7 } ;
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { iswap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #endif
    vec2 = v2 ;
    iswap.apply( qclab::Op::ConjTrans , 2 , vec2 ) ;
    check2 = { 3 , T(0,-2) , T(0,-5) , 7 } ;
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { iswap.apply_device( qclab::Op::ConjTrans , 2 , vec2_ ) ; }
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , T(0,4) , T(0,1) , T(0,2) , T(0,7) , 8 , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , 5 , T(0,-4) , T(0,-1) , T(0,-2) , T(0,-7) , 8 , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    iswap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,2) , T(0,5) , 7 , 4 , T(0,8) , T(0,1) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,-2) , T(0,-5) , 7 , 4 , T(0,-8) , T(0,-1) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , T(0,4) , T(0,1) , T(0,2) , T(0,7) , 8 , 3 ,
                 7 , 2 , T(0,8) , T(0,9) , T(0,5) , T(0,6) , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , T(0,-4) , T(0,-1) , T(0,-2) , T(0,-7) , 8 , 3 ,
               7 , 2 , T(0,-8) , T(0,-9) , T(0,-5) , T(0,-6) , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    iswap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , T(0,7) , T(0,2) , T(0,5) , T(0,6) ,
               T(0,4) , T(0,1) , T(0,8) , T(0,3) , 8 , 9 , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , T(0,-7) , T(0,-2) , T(0,-5) , T(0,-6) ,
               T(0,-4) , T(0,-1) , T(0,-8) , T(0,-3) , 8 , 9 , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    iswap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , T(0,2) , T(0,5) , 7 , 4 , T(0,8) , T(0,1) , 3 ,
               7 , T(0,5) , T(0,2) , 6 , 8 , T(0,5) , T(0,9) , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , T(0,-2) , T(0,-5) , 7 , 4 , T(0,-8) , T(0,-1) , 3 ,
               7 , T(0,-5) , T(0,-2) , 6 , 8 , T(0,-5) , T(0,-9) , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , T(0,4) , 2 , T(0,8) , T(0,5) , 1 , T(0,7) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,-4) , 2 , T(0,-8) , T(0,-5) , 1 , T(0,-7) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , mat * iswap.matrix() ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswap.matrix() * mat ) ;

    auto iswapH = qclab::dense::conjTrans( iswap.matrix() ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , mat * iswapH ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswapH * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( iswap.matrix() , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( iswap.matrix() , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( iswapH , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( iswapH , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    iswap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( I1 , iswap.matrix() ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( I1 , iswap.matrix() ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( I1 , iswapH ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( I1 , iswapH ) ) ;
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 2 ) ;

    const T i(0,1) ;
    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = i ;
    check(2,2) = 1 ;
    check(6,3) = i ;
    check(1,4) = i ;
    check(5,5) = 1 ;
    check(3,6) = i ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , check ) ;
  }

}